

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns.c
# Opt level: O0

void NoiseEstimation(NoiseSuppressionC *self,float *lmagn,float *noise)

{
  float fVar1;
  float local_3c;
  float norm_counter_weight;
  float delta;
  size_t offset;
  size_t s;
  size_t i;
  float *noise_local;
  float *lmagn_local;
  NoiseSuppressionC *self_local;
  
  _norm_counter_weight = 0;
  if (self->updates < 200) {
    self->updates = self->updates + 1;
  }
  for (offset = 0; offset < 3; offset = offset + 1) {
    _norm_counter_weight = offset * self->magnLen;
    fVar1 = 1.0 / (float)(self->counter[offset] + 1);
    for (s = 0; s < self->magnLen; s = s + 1) {
      if (self->density[_norm_counter_weight + s] <= 1.0) {
        local_3c = 40.0;
      }
      else {
        local_3c = 40.0 / self->density[_norm_counter_weight + s];
      }
      if (lmagn[s] < self->lquantile[_norm_counter_weight + s] ||
          lmagn[s] == self->lquantile[_norm_counter_weight + s]) {
        self->lquantile[_norm_counter_weight + s] =
             -(local_3c * 0.75) * fVar1 + self->lquantile[_norm_counter_weight + s];
      }
      else {
        self->lquantile[_norm_counter_weight + s] =
             local_3c * 0.25 * fVar1 + self->lquantile[_norm_counter_weight + s];
      }
      if (ABS(lmagn[s] - self->lquantile[_norm_counter_weight + s]) < 0.01) {
        self->density[_norm_counter_weight + s] =
             ((float)self->counter[offset] * self->density[_norm_counter_weight + s] + 50.0) * fVar1
        ;
      }
    }
    if ((199 < self->counter[offset]) && (self->counter[offset] = 0, 199 < self->updates)) {
      for (s = 0; s < self->magnLen; s = s + 1) {
        fVar1 = expf(self->lquantile[_norm_counter_weight + s]);
        self->quantile[s] = fVar1;
      }
    }
    self->counter[offset] = self->counter[offset] + 1;
  }
  if (self->updates < 200) {
    for (s = 0; s < self->magnLen; s = s + 1) {
      fVar1 = expf(self->lquantile[_norm_counter_weight + s]);
      self->quantile[s] = fVar1;
    }
    memcpy(noise,self->quantile,self->magnLen << 2);
  }
  else {
    memcpy(noise,self->quantile,self->magnLen << 2);
  }
  return;
}

Assistant:

static void NoiseEstimation(NoiseSuppressionC *self, float *lmagn, float *noise) {
    size_t i, s, offset = 0;
    float delta;

    if (self->updates < END_STARTUP_LONG) {
        self->updates++;
    }

    // Loop over simultaneous estimates.
    for (s = 0; s < SIMULT; s++) {
        offset = s * self->magnLen;
        float norm_counter_weight = 1.f / (self->counter[s] + 1);
        // newquantest(...)
        for (i = 0; i < self->magnLen; i++) {
            // Compute delta.
            if (self->density[offset + i] > 1.0) {
                delta = FACTOR / self->density[offset + i];
            } else {
                delta = FACTOR;
            }
            // Update log quantile estimate.
            if (lmagn[i] > self->lquantile[offset + i]) {
                self->lquantile[offset + i] += QUANTILE * delta * norm_counter_weight;
            } else {
                self->lquantile[offset + i] -= (1.f - QUANTILE) * delta * norm_counter_weight;
            }

            // Update density estimate.
            if (fabsf(lmagn[i] - self->lquantile[offset + i]) < WIDTH) {
                self->density[offset + i] =
                        ((float) self->counter[s] * self->density[offset + i] + 1.f / (2.f * WIDTH)) *
                        norm_counter_weight;
            }
        }  // End loop over magnitude spectrum.

        if (self->counter[s] >= END_STARTUP_LONG) {
            self->counter[s] = 0;
            if (self->updates >= END_STARTUP_LONG) {
                for (i = 0; i < self->magnLen; i++) {
                    self->quantile[i] = expf(self->lquantile[offset + i]);
                }
            }
        }

        self->counter[s]++;
    }  // End loop over simultaneous estimates.

    // Sequentially update the noise during startup.
    if (self->updates < END_STARTUP_LONG) {
        // Use the last "s" to get noise during startup that differ from zero.
        for (i = 0; i < self->magnLen; i++) {
            self->quantile[i] = expf(self->lquantile[offset + i]);
        }
        memcpy(noise, self->quantile, self->magnLen * sizeof(*noise));
    } else {
        memcpy(noise, self->quantile, self->magnLen * sizeof(*noise));
    }
}